

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processLine(Binasc *this,ostream *out,string *input,int lineCount)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_81;
  string local_80;
  undefined4 local_5c;
  undefined1 local_58 [8];
  string word;
  int length;
  int i;
  int status;
  int lineCount_local;
  string *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  length = 1;
  word.field_2._12_4_ = 0;
  word.field_2._8_4_ = std::__cxx11::string::size();
  std::__cxx11::string::string((string *)local_58);
  while( true ) {
    if ((int)word.field_2._8_4_ <= (int)word.field_2._12_4_) {
      this_local._4_4_ = 1;
      goto LAB_00140589;
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (((*pcVar1 == ';') ||
        (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar1 == '#')) ||
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar1 == '/')) break;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (((*pcVar1 == ' ') ||
        (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar1 == '\n')) ||
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar1 == '\t')) {
      word.field_2._12_4_ = word.field_2._12_4_ + 1;
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (*pcVar1 == '+') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80," \n\t",&local_81);
        word.field_2._12_4_ = getWord(this,(string *)local_58,input,&local_80,word.field_2._12_4_);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        length = processAsciiWord(this,out,(string *)local_58,lineCount);
      }
      else {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
        if (*pcVar1 == '\"') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b8,"\"",&local_b9);
          word.field_2._12_4_ = getWord(this,(string *)local_58,input,&local_b8,word.field_2._12_4_)
          ;
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          length = processStringWord(this,out,(string *)local_58,lineCount);
        }
        else {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
          if (*pcVar1 == 'v') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_e0," \n\t",&local_e1);
            word.field_2._12_4_ =
                 getWord(this,(string *)local_58,input,&local_e0,word.field_2._12_4_);
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_e1);
            length = processVlvWord(this,out,(string *)local_58,lineCount);
          }
          else {
            pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
            if (*pcVar1 == 'p') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_108," \n\t",&local_109);
              word.field_2._12_4_ =
                   getWord(this,(string *)local_58,input,&local_108,word.field_2._12_4_);
              std::__cxx11::string::~string((string *)&local_108);
              std::allocator<char>::~allocator((allocator<char> *)&local_109);
              length = processMidiPitchBendWord(this,out,(string *)local_58,lineCount);
            }
            else {
              pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input);
              if (*pcVar1 == 't') {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_130," \n\t",&local_131);
                word.field_2._12_4_ =
                     getWord(this,(string *)local_58,input,&local_130,word.field_2._12_4_);
                std::__cxx11::string::~string((string *)&local_130);
                std::allocator<char>::~allocator((allocator<char> *)&local_131);
                length = processMidiTempoWord(this,out,(string *)local_58,lineCount);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_158," \n\t",&local_159);
                word.field_2._12_4_ =
                     getWord(this,(string *)local_58,input,&local_158,word.field_2._12_4_);
                std::__cxx11::string::~string((string *)&local_158);
                std::allocator<char>::~allocator((allocator<char> *)&local_159);
                lVar2 = std::__cxx11::string::find((char)local_58,0x27);
                if (lVar2 == -1) {
                  lVar2 = std::__cxx11::string::find((char)local_58,0x2c);
                  if ((lVar2 == -1) && (uVar3 = std::__cxx11::string::size(), uVar3 < 3)) {
                    length = processHexWord(this,out,(string *)local_58,lineCount);
                  }
                  else {
                    length = processBinaryWord(this,out,(string *)local_58,lineCount);
                  }
                }
                else {
                  length = processDecimalWord(this,out,(string *)local_58,lineCount);
                }
              }
            }
          }
        }
      }
      if (length == 0) {
        this_local._4_4_ = 0;
LAB_00140589:
        local_5c = 1;
        std::__cxx11::string::~string((string *)local_58);
        return this_local._4_4_;
      }
    }
  }
  this_local._4_4_ = length;
  goto LAB_00140589;
}

Assistant:

int Binasc::processLine(std::ostream& out, const std::string& input,
		int lineCount) {
	int status = 1;
	int i = 0;
	int length = (int)input.size();
	std::string word;
	while (i<length) {
		if ((input[i] == ';') || (input[i] == '#') || (input[i] == '/')) {
			// comment to end of line, so ignore
			return status;
		} else if ((input[i] == ' ') || (input[i] == '\n')
				|| (input[i] == '\t')) {
			// ignore whitespace
			i++;
			continue;
		} else if (input[i] == '+') {
			i = getWord(word, input, " \n\t", i);
			status = processAsciiWord(out, word, lineCount);
		} else if (input[i] == '"') {
			i = getWord(word, input, "\"", i);
			status = processStringWord(out, word, lineCount);
		} else if (input[i] == 'v') {
			i = getWord(word, input, " \n\t", i);
			status = processVlvWord(out, word, lineCount);
		} else if (input[i] == 'p') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiPitchBendWord(out, word, lineCount);
		} else if (input[i] == 't') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiTempoWord(out, word, lineCount);
		} else {
			i = getWord(word, input, " \n\t", i);
			if (word.find('\'') != std::string::npos) {
				status = processDecimalWord(out, word, lineCount);
			} else if ((word.find(',') != std::string::npos)
					|| (word.size() > 2)) {
				status = processBinaryWord(out, word, lineCount);
			} else {
				status = processHexWord(out, word, lineCount);
			}
		}

		if (status == 0) {
			return 0;
		}

	}

	return 1;
}